

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O1

void __thiscall V2Chan::process(V2Chan *this,int nsamples)

{
  StereoSample *dest;
  float fVar1;
  V2Instance *pVVar2;
  V2Instance *pVVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar4 = (ulong)(uint)nsamples;
  pVVar2 = this->inst;
  dest = pVVar2->chanbuf;
  if (0 < nsamples) {
    fVar1 = this->aarcv;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      uVar5 = 0;
      do {
        dest[uVar5].field_0.l = pVVar2->auxabuf[uVar5].field_0.l * fVar1 + dest[uVar5].field_0.l;
        *(float *)((long)pVVar2->chanbuf + uVar5 * 8 + 4) =
             *(float *)((long)pVVar2->auxabuf + uVar5 * 8 + 4) * fVar1 +
             *(float *)((long)pVVar2->chanbuf + uVar5 * 8 + 4);
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  if (0 < nsamples) {
    fVar1 = this->abrcv;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      pVVar3 = this->inst;
      uVar5 = 0;
      do {
        pVVar2->chanbuf[uVar5].field_0.l =
             pVVar3->auxbbuf[uVar5].field_0.l * fVar1 + pVVar2->chanbuf[uVar5].field_0.l;
        *(float *)((long)pVVar2->chanbuf + uVar5 * 8 + 4) =
             *(float *)((long)pVVar3->auxbbuf + uVar5 * 8 + 4) * fVar1 +
             *(float *)((long)pVVar2->chanbuf + uVar5 * 8 + 4);
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  V2DCFilter::renderStereo(&this->dcf1,dest,dest,nsamples);
  V2Comp::render(&this->comp,dest,nsamples);
  V2Boost::render(&this->boost,dest,nsamples);
  if (this->fxr == 0) {
    V2Dist::renderStereo(&this->dist,dest,dest,nsamples);
    V2DCFilter::renderStereo(&this->dcf2,dest,dest,nsamples);
    V2ModDel::renderChan(&this->chorus,dest,nsamples);
  }
  else {
    V2ModDel::renderChan(&this->chorus,dest,nsamples);
    V2Dist::renderStereo(&this->dist,dest,dest,nsamples);
    V2DCFilter::renderStereo(&this->dcf2,dest,dest,nsamples);
  }
  pVVar3 = this->inst;
  if (0 < nsamples) {
    fVar1 = this->a1gain;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      uVar5 = 0;
      do {
        pVVar3->aux1buf[uVar5] =
             (pVVar2->chanbuf[uVar5].field_0.l + *(float *)((long)pVVar2->chanbuf + uVar5 * 8 + 4))
             * fVar1 + pVVar3->aux1buf[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  if (0 < nsamples) {
    fVar1 = this->a2gain;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      uVar5 = 0;
      do {
        pVVar3->aux2buf[uVar5] =
             (pVVar2->chanbuf[uVar5].field_0.l + *(float *)((long)pVVar2->chanbuf + uVar5 * 8 + 4))
             * fVar1 + pVVar3->aux2buf[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  if (0 < nsamples) {
    fVar1 = this->aasnd;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      uVar5 = 0;
      do {
        pVVar3->auxabuf[uVar5].field_0.l =
             pVVar2->chanbuf[uVar5].field_0.l * fVar1 + pVVar3->auxabuf[uVar5].field_0.l;
        *(float *)((long)pVVar3->auxabuf + uVar5 * 8 + 4) =
             *(float *)((long)pVVar2->chanbuf + uVar5 * 8 + 4) * fVar1 +
             *(float *)((long)pVVar3->auxabuf + uVar5 * 8 + 4);
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  if (0 < nsamples) {
    fVar1 = this->absnd;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      pVVar3 = this->inst;
      uVar5 = 0;
      do {
        pVVar3->auxbbuf[uVar5].field_0.l =
             pVVar2->chanbuf[uVar5].field_0.l * fVar1 + pVVar3->auxbbuf[uVar5].field_0.l;
        *(float *)((long)pVVar3->auxbbuf + uVar5 * 8 + 4) =
             *(float *)((long)pVVar2->chanbuf + uVar5 * 8 + 4) * fVar1 +
             *(float *)((long)pVVar3->auxbbuf + uVar5 * 8 + 4);
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  if (0 < nsamples) {
    fVar1 = this->chgain;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      pVVar3 = this->inst;
      uVar5 = 0;
      do {
        pVVar3->mixbuf[uVar5].field_0.l =
             pVVar2->chanbuf[uVar5].field_0.l * fVar1 + pVVar3->mixbuf[uVar5].field_0.l;
        *(float *)((long)pVVar3->mixbuf + uVar5 * 8 + 4) =
             *(float *)((long)pVVar2->chanbuf + uVar5 * 8 + 4) * fVar1 +
             *(float *)((long)pVVar3->mixbuf + uVar5 * 8 + 4);
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  return;
}

Assistant:

void process(int nsamples)
    {
        StereoSample *chan = inst->chanbuf;

        // AuxA/B receive (stereo)
        accumulate(chan, inst->auxabuf, nsamples, aarcv);
        accumulate(chan, inst->auxbbuf, nsamples, abrcv);

        // Filters
        dcf1.renderStereo(chan, chan, nsamples);
        DEBUG_PLOT_STEREO(&dcf1, chan, nsamples);
        comp.render(chan, nsamples);
        boost.render(chan, nsamples);
        if (fxr == FXR_DIST_THEN_CHORUS)
        {
            dist.renderStereo(chan, chan, nsamples);
            dcf2.renderStereo(chan, chan, nsamples);
            chorus.renderChan(chan, nsamples);
        }
        else // FXR_CHORUS_THEN_DIST
        {
            chorus.renderChan(chan, nsamples);
            dist.renderStereo(chan, chan, nsamples);
            dcf2.renderStereo(chan, chan, nsamples);
        }

        // Aux1/2 send (mono)
        accumulateMonoMix(inst->aux1buf, chan, nsamples, a1gain);
        accumulateMonoMix(inst->aux2buf, chan, nsamples, a2gain);

        // AuxA/B send (stereo)
        accumulate(inst->auxabuf, chan, nsamples, aasnd);
        accumulate(inst->auxbbuf, chan, nsamples, absnd);

        // Channel buffer to mix buffer (stereo)
        accumulate(inst->mixbuf, chan, nsamples, chgain);

        DEBUG_PLOT_STEREO(this, chan, nsamples);
    }